

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void * __thiscall
pstd::pmr::monotonic_buffer_resource::do_allocate
          (monotonic_buffer_resource *this,size_t bytes,size_t align)

{
  MemoryBlock *__x;
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  void *pvVar3;
  _List_node_base *p_Var4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  value_type local_28;
  undefined4 extraout_var_00;
  
  uVar7 = this->blockSize;
  if (uVar7 < bytes) {
    iVar2 = (*this->upstreamResource->_vptr_memory_resource[2])(this->upstreamResource,bytes,align);
    local_28.ptr = (void *)CONCAT44(extraout_var,iVar2);
    local_28.size = bytes;
    std::__cxx11::
    list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
    ::push_back(&this->usedBlocks,&local_28);
    p_Var4 = (this->usedBlocks).
             super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  }
  else {
    uVar5 = this->currentBlockPos;
    if (uVar5 % align != 0) {
      uVar5 = (uVar5 + align) - uVar5 % align;
      this->currentBlockPos = uVar5;
    }
    uVar1 = (this->currentBlock).size;
    __x = &this->currentBlock;
    if (uVar1 < uVar5 + bytes) {
      if (uVar1 != 0) {
        std::__cxx11::
        list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
        ::push_back(&this->usedBlocks,__x);
        __x->ptr = (void *)0x0;
        (this->currentBlock).size = 0;
        uVar7 = this->blockSize;
      }
      if (uVar7 == 0) {
        sVar6 = 0;
        pvVar3 = (void *)0x0;
      }
      else {
        iVar2 = (*this->upstreamResource->_vptr_memory_resource[2])
                          (this->upstreamResource,uVar7,0x10);
        pvVar3 = (void *)CONCAT44(extraout_var_00,iVar2);
        sVar6 = this->blockSize;
      }
      (this->currentBlock).ptr = pvVar3;
      (this->currentBlock).size = sVar6;
      uVar5 = 0;
    }
    else {
      pvVar3 = __x->ptr;
    }
    p_Var4 = (_List_node_base *)((long)pvVar3 + uVar5);
    this->currentBlockPos = bytes + uVar5;
  }
  return p_Var4;
}

Assistant:

void *do_allocate(size_t bytes, size_t align) override {
        if (bytes > blockSize) {
            // We've got a big allocation; let the current block be so that
            // smaller allocations have a chance at using up more of it.
            usedBlocks.push_back(
                MemoryBlock{upstreamResource->allocate(bytes, align), bytes});
            return usedBlocks.back().ptr;
        }

        if ((currentBlockPos % align) != 0)
            currentBlockPos += align - (currentBlockPos % align);
        DCHECK_EQ(0, currentBlockPos % align);

        if (currentBlockPos + bytes > currentBlock.size) {
            // Add current block to _usedBlocks_ list
            if (currentBlock.size) {
                usedBlocks.push_back(currentBlock);
                currentBlock = {};
            }

            currentBlock = {
                upstreamResource->allocate(blockSize, alignof(std::max_align_t)),
                blockSize};
            currentBlockPos = 0;
        }

        void *ptr = (char *)currentBlock.ptr + currentBlockPos;
        currentBlockPos += bytes;
        return ptr;
    }